

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void __thiscall
xlib::Log::Format<std::__cxx11::string,unsigned_short>
          (Log *this,string *format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first,
          unsigned_short *rest)

{
  ulong uVar1;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream oss;
  size_t index;
  unsigned_short *rest_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first_local;
  string *format_local;
  Log *this_local;
  
  uVar1 = std::__cxx11::string::find_first_of((char *)format,0x13e44e);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,(string *)first);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::replace((ulong)format,uVar1,(string *)0x2);
    std::__cxx11::string::~string(local_1d8);
    Format<unsigned_short>(this,format,rest);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return;
}

Assistant:

void Format(std::string* format,  const First& first, const Rest&... rest) {
        size_t index = format->find_first_of("%v");
        if (index == std::string::npos) {
            return;
        }
        std::ostringstream oss;
        oss << first;
        format->replace(index, 2, oss.str());
        Format(format, rest...);
    }